

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatastream.h
# Opt level: O3

QDataStream *
QtPrivate::readArrayBasedContainer<QList<QKeyCombination>>(QDataStream *s,QList<QKeyCombination> *c)

{
  QDataStream QVar1;
  char cVar2;
  undefined1 *asize;
  long in_FS_OFFSET;
  quint32 first;
  undefined1 *local_48;
  QKeyCombination local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QVar1 = s[0x13];
  cVar2 = QDataStream::isDeviceTransactionStarted();
  if (cVar2 == '\0') {
    QDataStream::resetStatus();
  }
  QList<QKeyCombination>::clear(c);
  local_3c.combination = 0xaaaaaaaa;
  QDataStream::operator>>(s,&local_3c.combination);
  asize = (undefined1 *)(ulong)(uint)local_3c.combination;
  if (asize == (undefined1 *)0xfffffffe) {
    if (0x15 < *(int *)(s + 0x18)) {
      local_48 = &DAT_aaaaaaaaaaaaaaaa;
      QDataStream::operator>>(s,(longlong *)&local_48);
      asize = local_48;
      if ((long)local_48 < 0) goto LAB_0040dbbb;
    }
  }
  else if (local_3c.combination == 0xffffffff) {
LAB_0040dbbb:
    QDataStream::setStatus((Status)s);
    goto LAB_0040dc5b;
  }
  QList<QKeyCombination>::reserve(c,(qsizetype)asize);
  if (asize != (undefined1 *)0x0) {
    do {
      local_3c.combination = 0x1ffffff;
      local_48 = (undefined1 *)CONCAT44(local_48._4_4_,0xaaaaaaaa);
      QDataStream::operator>>(s,(int *)&local_48);
      local_3c.combination = (uint)local_48;
      if (s[0x13] != (QDataStream)0x0) {
        QList<QKeyCombination>::clear(c);
        break;
      }
      QMovableArrayOps<QKeyCombination>::emplace<QKeyCombination_const&>
                ((QMovableArrayOps<QKeyCombination> *)c,(c->d).size,&local_3c);
      QList<QKeyCombination>::end(c);
      asize = asize + -1;
    } while (asize != (undefined1 *)0x0);
  }
LAB_0040dc5b:
  if (QVar1 != (QDataStream)0x0) {
    QDataStream::resetStatus();
    QDataStream::setStatus((Status)s);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return s;
}

Assistant:

QDataStream &readArrayBasedContainer(QDataStream &s, Container &c)
{
    StreamStateSaver stateSaver(&s);

    c.clear();
    qint64 size = QDataStream::readQSizeType(s);
    qsizetype n = size;
    if (size != n || size < 0) {
        s.setStatus(QDataStream::SizeLimitExceeded);
        return s;
    }
    c.reserve(n);
    for (qsizetype i = 0; i < n; ++i) {
        typename Container::value_type t;
        s >> t;
        if (s.status() != QDataStream::Ok) {
            c.clear();
            break;
        }
        c.append(t);
    }

    return s;
}